

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwtest2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  long in_RSI;
  int in_EDI;
  NaException *ex;
  NaReal fTmp;
  NaReal fOut;
  NaReal fIn;
  NaReal fNoise;
  NaReal fSignal;
  NaDataFile *dfIn;
  NaDataFile *dfOut;
  NaDataFile *dfNoise;
  NaDataFile *dfSignal;
  NaConfigFile conf2_file;
  NaConfigFile conf1_file;
  NaConfigPart *conf2_list [1];
  NaConfigPart *conf1_list [1];
  NaTransFunc dtf2;
  NaTransFunc dtf1;
  NaReal e;
  NaReal e2;
  int n;
  char *in_file;
  char *out_file;
  char *noise_file;
  char *signal_file;
  char *dtf2_file;
  char *dtf1_file;
  byte local_c4a;
  undefined1 *local_c18;
  undefined1 *local_c10;
  double local_c00;
  double local_bf8;
  double local_bf0;
  double local_be8;
  double local_be0;
  long *local_bd8;
  long *local_bd0;
  long *local_bc8;
  long *local_bc0;
  NaConfigFile local_bb8 [1176];
  NaConfigFile local_720 [1176];
  undefined1 *local_288;
  undefined1 *local_280;
  NaTransFunc local_278 [32];
  undefined1 auStack_258 [248];
  NaTransFunc local_160 [32];
  undefined1 auStack_140 [232];
  double local_58;
  double local_50;
  uint local_44;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  int local_4;
  
  local_4 = 0;
  if ((in_EDI == 6) || (in_EDI == 7)) {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_20 = *(undefined8 *)(in_RSI + 0x10);
    local_28 = *(char **)(in_RSI + 0x18);
    local_30 = *(char **)(in_RSI + 0x20);
    local_38 = *(char **)(in_RSI + 0x28);
    local_40 = (char *)0x0;
    if (in_EDI == 7) {
      local_40 = *(char **)(in_RSI + 0x30);
    }
    NaOpenLogFile("dwtest.log");
    NaTransFunc::NaTransFunc(local_160);
    NaTransFunc::NaTransFunc(local_278);
    local_c10 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x160) {
      local_c10 = auStack_140;
    }
    local_280 = local_c10;
    local_c18 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x278) {
      local_c18 = auStack_258;
    }
    local_288 = local_c18;
    NaConfigFile::NaConfigFile(local_720,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::NaConfigFile(local_bb8,";NeuCon transfer",1,0,".cna","[ ] ;");
    NaConfigFile::AddPartitions((uint)local_720,(NaConfigPart **)0x1);
    NaConfigFile::AddPartitions((uint)local_bb8,(NaConfigPart **)0x1);
    NaConfigFile::LoadFromFile((char *)local_720);
    NaConfigFile::LoadFromFile((char *)local_bb8);
    local_bc0 = (long *)OpenInputDataFile(local_28);
    local_bc8 = (long *)OpenInputDataFile(local_30);
    local_bd0 = (long *)OpenOutputDataFile(local_38,bdtAuto,1);
    local_bd8 = (long *)0x0;
    if (local_40 != (char *)0x0) {
      local_bd8 = (long *)OpenOutputDataFile(local_40,bdtAuto,1);
    }
    (**(code **)(*local_bc0 + 0x28))();
    (**(code **)(*local_bc8 + 0x28))();
    NaTransFunc::Reset();
    NaTransFunc::Reset();
    local_44 = 0;
    local_58 = 0.0;
    local_50 = 0.0;
    do {
      local_44 = local_44 + 1;
      local_be0 = (double)(**(code **)(*local_bc0 + 0x18))(local_bc0,0);
      local_be8 = (double)(**(code **)(*local_bc8 + 0x18))(local_bc8,0);
      local_bf0 = (local_be0 + local_be8) - local_58;
      NaTransFunc::Function((double *)local_160,&local_bf0);
      NaTransFunc::Function((double *)local_278,&local_c00);
      if (local_bd8 != (long *)0x0) {
        (**(code **)(*local_bd8 + 0x30))();
        (**(code **)(*local_bd8 + 0x10))(local_bf0);
      }
      (**(code **)(*local_bd0 + 0x30))();
      (**(code **)(*local_bd0 + 0x10))(local_bf8);
      local_58 = local_bf8;
      local_50 = (local_bf8 - local_be0) * (local_bf8 - local_be0) + local_50;
      bVar1 = (**(code **)(*local_bc0 + 0x20))();
      local_c4a = 0;
      if ((bVar1 & 1) != 0) {
        local_c4a = (**(code **)(*local_bc8 + 0x20))();
      }
    } while ((local_c4a & 1) != 0);
    printf("Series length=%d samples\n",(ulong)local_44);
    printf("Mean squared error=%g\n",local_50 / (double)(int)local_44);
    if (local_bd8 != (long *)0x0) {
      (**(code **)(*local_bd8 + 8))();
    }
    if (local_bd0 != (long *)0x0) {
      (**(code **)(*local_bd0 + 8))();
    }
    if (local_bc8 != (long *)0x0) {
      (**(code **)(*local_bc8 + 8))();
    }
    if (local_bc0 != (long *)0x0) {
      (**(code **)(*local_bc0 + 8))();
    }
    NaConfigFile::~NaConfigFile(local_bb8);
    NaConfigFile::~NaConfigFile(local_720);
    NaTransFunc::~NaTransFunc(local_278);
    NaTransFunc::~NaTransFunc(local_160);
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"Error: need 5 or 6 arguments\n");
    printf("Usage: dwtest2 ContrTrFunc PlantTrFunc SignalSeries NoiseSeries OutSeries [InSeries]\n")
    ;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6 && argc != 7)
    {
      fprintf(stderr, "Error: need 5 or 6 arguments\n");
      printf("Usage: dwtest2 ContrTrFunc PlantTrFunc SignalSeries NoiseSeries"\
	     " OutSeries [InSeries]\n");
      return 1;
    }

  char	*dtf1_file = argv[1];
  char	*dtf2_file = argv[2];
  char	*signal_file = argv[3];
  char	*noise_file = argv[4];
  char	*out_file = argv[5];
  char	*in_file = NULL;

  if(argc == 7)
    in_file = argv[6];

  NaOpenLogFile("dwtest.log");

  try{
    int			n;
    NaReal		e2, e;
    NaTransFunc		dtf1, dtf2;
    NaConfigPart	*conf1_list[] = { &dtf1 };
    NaConfigPart	*conf2_list[] = { &dtf2 };
    NaConfigFile	conf1_file(";NeuCon transfer", 1, 0);
    NaConfigFile	conf2_file(";NeuCon transfer", 1, 0);
    conf1_file.AddPartitions(NaNUMBER(conf1_list), conf1_list);
    conf2_file.AddPartitions(NaNUMBER(conf2_list), conf2_list);
    conf1_file.LoadFromFile(dtf1_file);
    conf2_file.LoadFromFile(dtf2_file);

    NaDataFile	*dfSignal = OpenInputDataFile(signal_file);
    NaDataFile	*dfNoise = OpenInputDataFile(noise_file);
    NaDataFile	*dfOut = OpenOutputDataFile(out_file, bdtAuto, 1);
    NaDataFile	*dfIn = NULL;

    if(NULL != in_file)
      dfIn = OpenOutputDataFile(in_file, bdtAuto, 1);

    dfSignal->GoStartRecord();
    dfNoise->GoStartRecord();
    dtf1.Reset();
    dtf2.Reset();
    n = 0;
    e = 0.;
    e2 = 0.;
    do{
      ++n;
      NaReal	fSignal, fNoise, fIn, fOut, fTmp;
      fSignal = dfSignal->GetValue();
      fNoise = dfNoise->GetValue();

      fIn = fSignal + fNoise - e;
      dtf1.Function(&fIn, &fTmp);
      dtf2.Function(&fTmp, &fOut);

      if(NULL != dfIn)
	{
	  dfIn->AppendRecord();
	  dfIn->SetValue(fIn);
	}

      dfOut->AppendRecord();
      dfOut->SetValue(fOut);

      e = fOut;
      e2 += (fOut - fSignal) * (fOut - fSignal);
    }while(dfSignal->GoNextRecord() && dfNoise->GoNextRecord());

    printf("Series length=%d samples\n", n);
    printf("Mean squared error=%g\n", e2/n);

    delete dfIn;
    delete dfOut;
    delete dfNoise;
    delete dfSignal;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}